

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::AtomicDeclarationTest<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (AtomicDeclarationTest<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  char *pcVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *pTVar4;
  reference pvVar5;
  undefined1 *local_250;
  string *fs_1;
  string *gs_1;
  string *tes_1;
  string *tcs_1;
  string *vs_1;
  string *cs_1;
  undefined1 *puStack_218;
  bool negative_build_test_result;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  char max_1 [16];
  char max [16];
  char it [16];
  long local_1b0;
  size_t i;
  string local_1a0 [8];
  string valid_iteration;
  string local_178 [8];
  string valid_definition;
  string valid_shader_source;
  GLenum pname;
  GLint max_atomics;
  string loop_end;
  string invalid_shader_source;
  string invalid_iteration;
  allocator<char> local_b9;
  string local_b8 [8];
  string invalid_definition;
  string indexing;
  string indent;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dimensions;
  string comment;
  Functions *gl;
  TestShaderType tested_shader_type_local;
  AtomicDeclarationTest<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).context_id);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  std::__cxx11::string::string
            ((string *)
             &dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)&indent.field_2 + 8));
  std::__cxx11::string::string((string *)(indexing.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(invalid_definition.field_2._M_local_buf + 8));
  pcVar1 = test_shader_compilation::uniform_atomic_uint;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,pcVar1,&local_b9);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::string((string *)(invalid_shader_source.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(loop_end.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&pname);
  valid_shader_source.field_2._12_4_ = 0;
  valid_shader_source.field_2._8_4_ = 0;
  std::__cxx11::string::string((string *)(valid_definition.field_2._M_local_buf + 8));
  pcVar1 = test_shader_compilation::uniform_atomic_uint;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,pcVar1,(allocator<char> *)(valid_iteration.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(valid_iteration.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string(local_1a0);
  switch(tested_shader_type) {
  case FRAGMENT_SHADER_TYPE:
    valid_shader_source.field_2._8_4_ = 0x92d6;
    break;
  case VERTEX_SHADER_TYPE:
    valid_shader_source.field_2._8_4_ = 0x92d2;
    break;
  case COMPUTE_SHADER_TYPE:
    valid_shader_source.field_2._8_4_ = 0x8265;
    break;
  case GEOMETRY_SHADER_TYPE:
    valid_shader_source.field_2._8_4_ = 0x92d5;
    break;
  case TESSELATION_CONTROL_SHADER_TYPE:
    valid_shader_source.field_2._8_4_ = 0x92d3;
    break;
  case TESSELATION_EVALUATION_SHADER_TYPE:
    valid_shader_source.field_2._8_4_ = 0x92d4;
    break;
  default:
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x1fcd);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))
            (valid_shader_source.field_2._8_4_,
             (undefined1 *)((long)&valid_shader_source.field_2 + 0xc));
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x1fd3);
  if (valid_shader_source.field_2._12_4_ != 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)&indent.field_2 + 8),
               8);
    prepareDimensions<glcts::ArraysOfArrays::Interface::GL>
              ((long)(int)valid_shader_source.field_2._12_4_,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)&indent.field_2 + 8))
    ;
    for (local_1b0 = 8; local_1b0 != 0; local_1b0 = local_1b0 + -1) {
      std::__cxx11::string::operator+=
                ((string *)(indexing.field_2._M_local_buf + 8),test_shader_compilation::indent_step)
      ;
      std::__cxx11::string::insert((ulong)&pname,(char *)0x0);
      std::__cxx11::string::insert((ulong)&pname,(string *)0x0);
      sprintf(max + 8,"i%u",(ulong)(8 - (int)local_1b0));
      std::__cxx11::string::operator+=((string *)(invalid_definition.field_2._M_local_buf + 8),"[");
      std::__cxx11::string::operator+=
                ((string *)(invalid_definition.field_2._M_local_buf + 8),max + 8);
      std::__cxx11::string::operator+=((string *)(invalid_definition.field_2._M_local_buf + 8),"]");
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          ((long)&indent.field_2 + 8),local_1b0 - 1);
      sprintf(max_1 + 8,"%u",(ulong)(uint)*pvVar5);
      std::__cxx11::string::operator+=(local_178,"[");
      std::__cxx11::string::operator+=(local_178,max_1 + 8);
      std::__cxx11::string::operator+=(local_178,"]");
      std::__cxx11::string::operator+=(local_1a0,(string *)(indexing.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=(local_1a0,"for (uint ");
      std::__cxx11::string::operator+=(local_1a0,max + 8);
      std::__cxx11::string::operator+=(local_1a0," = 0; ");
      std::__cxx11::string::operator+=(local_1a0,max + 8);
      std::__cxx11::string::operator+=(local_1a0," < ");
      std::__cxx11::string::operator+=(local_1a0,max_1 + 8);
      std::__cxx11::string::operator+=(local_1a0,"; ++");
      std::__cxx11::string::operator+=(local_1a0,max + 8);
      std::__cxx11::string::operator+=(local_1a0,")\n");
      std::__cxx11::string::operator+=(local_1a0,(string *)(indexing.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=(local_1a0,"{\n");
      if (local_1b0 == 1) {
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            ((long)&indent.field_2 + 8),0);
        sprintf(max_1 + 8,"%u",(ulong)((int)*pvVar5 + 1));
      }
      std::__cxx11::string::operator+=(local_b8,"[");
      std::__cxx11::string::operator+=(local_b8,max_1 + 8);
      std::__cxx11::string::operator+=(local_b8,"]");
      std::__cxx11::string::operator+=
                ((string *)(invalid_shader_source.field_2._M_local_buf + 8),
                 (string *)(indexing.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=
                ((string *)(invalid_shader_source.field_2._M_local_buf + 8),"for (uint ");
      std::__cxx11::string::operator+=
                ((string *)(invalid_shader_source.field_2._M_local_buf + 8),max + 8);
      std::__cxx11::string::operator+=
                ((string *)(invalid_shader_source.field_2._M_local_buf + 8)," = 0; ");
      std::__cxx11::string::operator+=
                ((string *)(invalid_shader_source.field_2._M_local_buf + 8),max + 8);
      std::__cxx11::string::operator+=
                ((string *)(invalid_shader_source.field_2._M_local_buf + 8)," < ");
      std::__cxx11::string::operator+=
                ((string *)(invalid_shader_source.field_2._M_local_buf + 8),max_1 + 8);
      std::__cxx11::string::operator+=
                ((string *)(invalid_shader_source.field_2._M_local_buf + 8),"; ++");
      std::__cxx11::string::operator+=
                ((string *)(invalid_shader_source.field_2._M_local_buf + 8),max + 8);
      std::__cxx11::string::operator+=
                ((string *)(invalid_shader_source.field_2._M_local_buf + 8),")\n");
      std::__cxx11::string::operator+=
                ((string *)(invalid_shader_source.field_2._M_local_buf + 8),
                 (string *)(indexing.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=
                ((string *)(invalid_shader_source.field_2._M_local_buf + 8),"{\n");
    }
    sprintf((char *)&cs,"%u",(ulong)(uint)valid_shader_source.field_2._12_4_);
    std::__cxx11::string::operator+=
              ((string *)
               &dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,"/* MAX_*_ATOMIC_COUNTERS = ");
    std::__cxx11::string::operator+=
              ((string *)
               &dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,(char *)&cs);
    std::__cxx11::string::operator+=
              ((string *)
               &dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage," */\n");
    std::__cxx11::string::operator+=
              ((string *)(loop_end.field_2._M_local_buf + 8),
               (string *)
               &dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::operator+=((string *)(loop_end.field_2._M_local_buf + 8),local_b8);
    std::__cxx11::string::operator+=
              ((string *)(loop_end.field_2._M_local_buf + 8)," a;\n\nvoid main()\n{\n");
    std::__cxx11::string::operator+=
              ((string *)(loop_end.field_2._M_local_buf + 8),
               (string *)(invalid_shader_source.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=
              ((string *)(loop_end.field_2._M_local_buf + 8),
               (string *)(indexing.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=
              ((string *)(loop_end.field_2._M_local_buf + 8),test_shader_compilation::indent_step);
    std::__cxx11::string::operator+=
              ((string *)(loop_end.field_2._M_local_buf + 8),"atomicCounterIncrement( a");
    std::__cxx11::string::operator+=
              ((string *)(loop_end.field_2._M_local_buf + 8),
               (string *)(invalid_definition.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)(loop_end.field_2._M_local_buf + 8)," );\n");
    std::__cxx11::string::operator+=((string *)(loop_end.field_2._M_local_buf + 8),(string *)&pname)
    ;
    std::__cxx11::string::operator+=
              ((string *)(valid_definition.field_2._M_local_buf + 8),
               (string *)
               &dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::operator+=
              ((string *)(valid_definition.field_2._M_local_buf + 8),local_178);
    std::__cxx11::string::operator+=
              ((string *)(valid_definition.field_2._M_local_buf + 8)," a;\n\nvoid main()\n{\n");
    std::__cxx11::string::operator+=
              ((string *)(valid_definition.field_2._M_local_buf + 8),local_1a0);
    std::__cxx11::string::operator+=
              ((string *)(valid_definition.field_2._M_local_buf + 8),
               (string *)(indexing.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=
              ((string *)(valid_definition.field_2._M_local_buf + 8),
               test_shader_compilation::indent_step);
    std::__cxx11::string::operator+=
              ((string *)(valid_definition.field_2._M_local_buf + 8),"atomicCounterIncrement( a");
    std::__cxx11::string::operator+=
              ((string *)(valid_definition.field_2._M_local_buf + 8),
               (string *)(invalid_definition.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)(valid_definition.field_2._M_local_buf + 8)," );\n");
    std::__cxx11::string::operator+=
              ((string *)(valid_definition.field_2._M_local_buf + 8),(string *)&pname);
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      break;
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::operator+=
                ((string *)(loop_end.field_2._M_local_buf + 8),"\n\tgl_Position = vec4(0.0);\n");
      break;
    case COMPUTE_SHADER_TYPE:
      break;
    case GEOMETRY_SHADER_TYPE:
      std::__cxx11::string::operator+=
                ((string *)(loop_end.field_2._M_local_buf + 8),(string *)emit_quad_abi_cxx11_);
      break;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::operator+=
                ((string *)(loop_end.field_2._M_local_buf + 8),(string *)set_tesseation_abi_cxx11_);
      break;
    case TESSELATION_EVALUATION_SHADER_TYPE:
      break;
    default:
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x203c);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=
              ((string *)(loop_end.field_2._M_local_buf + 8),(string *)shader_end_abi_cxx11_);
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      break;
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::operator+=
                ((string *)(valid_definition.field_2._M_local_buf + 8),
                 "\n\tgl_Position = vec4(0.0);\n");
      break;
    case COMPUTE_SHADER_TYPE:
      break;
    case GEOMETRY_SHADER_TYPE:
      std::__cxx11::string::operator+=
                ((string *)(valid_definition.field_2._M_local_buf + 8),
                 (string *)emit_quad_abi_cxx11_);
      break;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::operator+=
                ((string *)(valid_definition.field_2._M_local_buf + 8),
                 (string *)set_tesseation_abi_cxx11_);
      break;
    case TESSELATION_EVALUATION_SHADER_TYPE:
      break;
    default:
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x203d);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=
              ((string *)(valid_definition.field_2._M_local_buf + 8),(string *)shader_end_abi_cxx11_
              );
    vs = (string *)empty_string_abi_cxx11_;
    tcs = (string *)default_vertex_shader_source_abi_cxx11_;
    tes = (string *)default_tc_shader_source_abi_cxx11_;
    gs = (string *)default_te_shader_source_abi_cxx11_;
    fs = (string *)default_geometry_shader_source_abi_cxx11_;
    puStack_218 = default_fragment_shader_source_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      puStack_218 = (undefined1 *)((long)&valid_definition.field_2 + 8);
      break;
    case VERTEX_SHADER_TYPE:
      tcs = (string *)((long)&valid_definition.field_2 + 8);
      break;
    case COMPUTE_SHADER_TYPE:
      vs = (string *)((long)&valid_definition.field_2 + 8);
      tcs = (string *)empty_string_abi_cxx11_;
      tes = (string *)empty_string_abi_cxx11_;
      gs = (string *)empty_string_abi_cxx11_;
      fs = (string *)empty_string_abi_cxx11_;
      puStack_218 = empty_string_abi_cxx11_;
      break;
    case GEOMETRY_SHADER_TYPE:
      fs = (string *)((long)&valid_definition.field_2 + 8);
      break;
    case TESSELATION_CONTROL_SHADER_TYPE:
      tes = (string *)((long)&valid_definition.field_2 + 8);
      break;
    case TESSELATION_EVALUATION_SHADER_TYPE:
      gs = (string *)((long)&valid_definition.field_2 + 8);
      break;
    default:
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x2040);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[10])(this,tcs,tes,gs,fs,puStack_218,vs,1,0);
    vs_1 = (string *)empty_string_abi_cxx11_;
    tcs_1 = (string *)default_vertex_shader_source_abi_cxx11_;
    tes_1 = (string *)default_tc_shader_source_abi_cxx11_;
    gs_1 = (string *)default_te_shader_source_abi_cxx11_;
    fs_1 = (string *)default_geometry_shader_source_abi_cxx11_;
    local_250 = default_fragment_shader_source_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      local_250 = (undefined1 *)((long)&loop_end.field_2 + 8);
      break;
    case VERTEX_SHADER_TYPE:
      tcs_1 = (string *)((long)&loop_end.field_2 + 8);
      break;
    case COMPUTE_SHADER_TYPE:
      vs_1 = (string *)((long)&loop_end.field_2 + 8);
      tcs_1 = (string *)empty_string_abi_cxx11_;
      tes_1 = (string *)empty_string_abi_cxx11_;
      gs_1 = (string *)empty_string_abi_cxx11_;
      fs_1 = (string *)empty_string_abi_cxx11_;
      local_250 = empty_string_abi_cxx11_;
      break;
    case GEOMETRY_SHADER_TYPE:
      fs_1 = (string *)((long)&loop_end.field_2 + 8);
      break;
    case TESSELATION_CONTROL_SHADER_TYPE:
      tes_1 = (string *)((long)&loop_end.field_2 + 8);
      break;
    case TESSELATION_EVALUATION_SHADER_TYPE:
      gs_1 = (string *)((long)&loop_end.field_2 + 8);
      break;
    default:
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x2048);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[10])(this,tcs_1,tes_1,gs_1,fs_1,local_250,vs_1,1,0);
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"It was expected that build process will fail",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x2051);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string((string *)(valid_definition.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&pname);
  std::__cxx11::string::~string((string *)(loop_end.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(invalid_shader_source.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)(invalid_definition.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(indexing.field_2._M_local_buf + 8));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)&indent.field_2 + 8));
  std::__cxx11::string::~string
            ((string *)
             &dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void AtomicDeclarationTest<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const char* indent_step		   = "    ";
	static const char* uniform_atomic_uint = "layout(binding = 0) uniform atomic_uint";

	const glw::Functions& gl = this->context_id.getRenderContext().getFunctions();

	std::string			comment;
	std::vector<size_t> dimensions;
	std::string			indent;
	std::string			indexing;
	std::string			invalid_definition = uniform_atomic_uint;
	std::string			invalid_iteration;
	std::string			invalid_shader_source;
	std::string			loop_end;
	glw::GLint			max_atomics = 0;
	glw::GLenum			pname		= 0;
	std::string			valid_shader_source;
	std::string			valid_definition = uniform_atomic_uint;
	std::string			valid_iteration;

	/* Select pname of max for stage */
	switch (tested_shader_type)
	{
	case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
		pname = GL_MAX_COMPUTE_ATOMIC_COUNTERS;
		break;
	case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
		pname = GL_MAX_FRAGMENT_ATOMIC_COUNTERS;
		break;
	case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
		pname = GL_MAX_GEOMETRY_ATOMIC_COUNTERS;
		break;
	case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
		pname = GL_MAX_TESS_CONTROL_ATOMIC_COUNTERS;
		break;
	case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
		pname = GL_MAX_TESS_EVALUATION_ATOMIC_COUNTERS;
		break;
	case TestCaseBase<API>::VERTEX_SHADER_TYPE:
		pname = GL_MAX_VERTEX_ATOMIC_COUNTERS;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	/* Get maximum */
	gl.getIntegerv(pname, &max_atomics);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	if (0 == max_atomics)
	{
		/* Not supported - skip */
		return;
	}
	else
	{
		dimensions.resize(API::MAX_ARRAY_DIMENSIONS);
		prepareDimensions<API>(max_atomics, dimensions);
	}

	/* Prepare parts of shader */
	for (size_t i = API::MAX_ARRAY_DIMENSIONS; i != 0; --i)
	{
		char it[16];
		char max[16];

		indent += indent_step;

		loop_end.insert(0, "}\n");
		loop_end.insert(0, indent);

		sprintf(it, "i%u", (unsigned int)(API::MAX_ARRAY_DIMENSIONS - i));

		indexing += "[";
		indexing += it;
		indexing += "]";

		sprintf(max, "%u", (unsigned int)(dimensions[i - 1]));

		valid_definition += "[";
		valid_definition += max;
		valid_definition += "]";

		valid_iteration += indent;
		valid_iteration += "for (uint ";
		valid_iteration += it;
		valid_iteration += " = 0; ";
		valid_iteration += it;
		valid_iteration += " < ";
		valid_iteration += max;
		valid_iteration += "; ++";
		valid_iteration += it;
		valid_iteration += ")\n";
		valid_iteration += indent;
		valid_iteration += "{\n";

		if (1 == i)
		{
			sprintf(max, "%u", (unsigned int)(dimensions[i - 1] + 1));
		}
		invalid_definition += "[";
		invalid_definition += max;
		invalid_definition += "]";

		invalid_iteration += indent;
		invalid_iteration += "for (uint ";
		invalid_iteration += it;
		invalid_iteration += " = 0; ";
		invalid_iteration += it;
		invalid_iteration += " < ";
		invalid_iteration += max;
		invalid_iteration += "; ++";
		invalid_iteration += it;
		invalid_iteration += ")\n";
		invalid_iteration += indent;
		invalid_iteration += "{\n";
	}

	{
		char max[16];

		sprintf(max, "%u", (unsigned int)(max_atomics));
		comment += "/* MAX_*_ATOMIC_COUNTERS = ";
		comment += max;
		comment += " */\n";
	}

	/* Prepare invalid source */
	invalid_shader_source += comment;
	invalid_shader_source += invalid_definition;
	invalid_shader_source += " a;\n\nvoid main()\n{\n";
	invalid_shader_source += invalid_iteration;
	invalid_shader_source += indent;
	invalid_shader_source += indent_step;
	invalid_shader_source += "atomicCounterIncrement( a";
	invalid_shader_source += indexing;
	invalid_shader_source += " );\n";
	invalid_shader_source += loop_end;

	/* Prepare valid source */
	valid_shader_source += comment;
	valid_shader_source += valid_definition;
	valid_shader_source += " a;\n\nvoid main()\n{\n";
	valid_shader_source += valid_iteration;
	valid_shader_source += indent;
	valid_shader_source += indent_step;
	valid_shader_source += "atomicCounterIncrement( a";
	valid_shader_source += indexing;
	valid_shader_source += " );\n";
	valid_shader_source += loop_end;

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, invalid_shader_source);
	DEFAULT_MAIN_ENDING(tested_shader_type, valid_shader_source);

	/* Execute test */
	EXECUTE_POSITIVE_TEST(tested_shader_type, valid_shader_source, true, false);

	/* Expect build failure for invalid shader source */
	{
		bool negative_build_test_result = false;

		try
		{
			EXECUTE_POSITIVE_TEST(tested_shader_type, invalid_shader_source, true, false);
		}
		catch (...)
		{
			negative_build_test_result = true;
		}

		if (false == negative_build_test_result)
		{
			TCU_FAIL("It was expected that build process will fail");
		}
	}
}